

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tripeaks.c
# Opt level: O0

Board * tripeaks_boardCreate(Card **cards,unsigned_long cardsCount)

{
  Board *pBVar1;
  uchar i;
  Board *board;
  Board *card;
  uchar spotIndex;
  Spot *in_stack_ffffffffffffffd8;
  Board *spot;
  SPOTTYPE spotType;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  byte bVar2;
  
  pBVar1 = board_create();
  card = pBVar1;
  spot_create((SPOTTYPE)((ulong)pBVar1 >> 0x38),(uchar)((ulong)pBVar1 >> 0x30));
  board_spotAdd((Board *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffd8);
  spot = pBVar1;
  spot_create((SPOTTYPE)((ulong)card >> 0x38),(uchar)((ulong)card >> 0x30));
  board_spotAdd((Board *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),(Spot *)spot)
  ;
  for (bVar2 = 0; bVar2 < 0x1c; bVar2 = bVar2 + 1) {
    spot_create((SPOTTYPE)((ulong)card >> 0x38),(uchar)((ulong)card >> 0x30));
    board_spotAdd((Board *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),(Spot *)spot);
  }
  for (bVar2 = 0; bVar2 < 0x1c; bVar2 = bVar2 + 1) {
    board_cardAdd((Board *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),(SPOTTYPE)((ulong)spot >> 0x38)
                  ,(uchar)((ulong)spot >> 0x30),(Card *)card);
  }
  while( true ) {
    spotIndex = (uchar)((ulong)spot >> 0x30);
    spotType = (SPOTTYPE)((ulong)spot >> 0x38);
    if (0x32 < bVar2) break;
    board_cardAdd((Board *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),spotType,spotIndex,(Card *)card
                 );
    bVar2 = bVar2 + 1;
  }
  board_cardAdd((Board *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),spotType,spotIndex,(Card *)card);
  return pBVar1;
}

Assistant:

Board * tripeaks_boardCreate(Card ** cards, unsigned long cardsCount)
{
	Board * board = board_create();
	unsigned char i;

	board_spotAdd(board, spot_create(STOCK, 0));
	board_spotAdd(board, spot_create(FOUNDATION, 0));

	for(i=0;i<28;i++)
	{
		board_spotAdd(board, spot_create(TABLEAU, i));
	}

	for(i=0;i<28;i++)
	{
		board_cardAdd(board, TABLEAU, i, cards[i]);
	}
	for(;i<51;i++)
	{
		board_cardAdd(board, STOCK, 0, cards[i]);
	}

	board_cardAdd(board, FOUNDATION, 0, cards[i]);

	return board;
}